

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

Error __thiscall
asmjit::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneHeap *heap,size_t newLength,size_t idealCapacity,
          bool newBitsValue)

{
  long lVar1;
  ulong *puVar2;
  Slot *__dest;
  Slot *__src;
  Slot *extraout_RAX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t size;
  ulong uVar3;
  size_t extraout_RDX_01;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  size_t allocatedCapacity;
  uint local_44;
  ulong local_38;
  
  uVar7 = (ulong)newBitsValue;
  if (idealCapacity < newLength) {
    _resize();
    return 1;
  }
  uVar6 = *(ulong *)(this + 8);
  if (newLength <= uVar6) {
    if ((newLength & 0x3f) != 0) {
      puVar2 = (ulong *)(*(long *)this + (newLength >> 6) * 8);
      *puVar2 = *puVar2 & ~(-1L << (newLength & 0x3f));
    }
    goto LAB_00167e46;
  }
  __src = *(Slot **)this;
  if (*(ulong *)(this + 0x10) < newLength) {
    uVar9 = idealCapacity + 0x3f & 0xffffffffffffffc0;
    if (uVar9 < newLength) {
      return 1;
    }
    if (heap->_zone == (Zone *)0x0) {
      _resize();
      __dest = extraout_RAX;
      size = extraout_RDX_01;
LAB_00167e6f:
      uVar3 = uVar9;
    }
    else {
      local_44 = (uint)newBitsValue;
      __dest = (Slot *)ZoneHeap::_alloc(heap,uVar9 >> 3,&local_38);
      if (__dest == (Slot *)0x0) {
        return 1;
      }
      size = extraout_RDX;
      uVar3 = local_38 * 8;
      if (local_38 * 8 < local_38) goto LAB_00167e6f;
    }
    if (uVar6 != 0) {
      memcpy(__dest,__src,(uVar6 + 0x40 >> 6) - 1);
      uVar7 = (ulong)local_44;
      size = extraout_RDX_00;
    }
    if (__src == (Slot *)0x0) {
LAB_00167d5e:
      *(Slot **)this = __dest;
      *(ulong *)(this + 0x10) = uVar3;
      __src = __dest;
      goto LAB_00167d65;
    }
    if (heap->_zone != (Zone *)0x0) {
      uVar9 = *(ulong *)(this + 0x10);
      if (uVar9 < 8) goto LAB_00167e81;
      if (uVar9 < 0x1008) {
        if (uVar9 < 0x408) {
          uVar8 = (uint)((uVar9 >> 3) + 0x1fffffffff >> 5);
        }
        else {
          uVar8 = (int)((uVar9 >> 3) + 0x3fffffff7f >> 6) + 4;
        }
        __src->next = heap->_slots[uVar8];
        heap->_slots[uVar8] = __src;
      }
      else {
        ZoneHeap::_releaseDynamic(heap,__src,size);
        uVar7 = (ulong)local_44;
      }
      goto LAB_00167d5e;
    }
LAB_00167e7c:
    _resize();
LAB_00167e81:
    _resize();
  }
LAB_00167d65:
  uVar9 = uVar6 >> 6;
  uVar8 = (uint)newLength & 0x3f;
  if ((uVar6 & 0x3f) != 0) {
    uVar4 = (uint)(uVar6 & 0x3f);
    uVar5 = 0;
    if ((uVar9 == newLength >> 6) && (uVar5 = uVar8, uVar8 <= uVar4)) {
      _resize();
      goto LAB_00167e7c;
    }
    __src[uVar9].next =
         (Slot *)((ulong)__src[uVar9].next | -(uVar7 & 0xff) << ((ulong)(uVar5 - uVar4) & 0x3f));
    uVar9 = uVar9 + 1;
  }
  uVar7 = newLength + 0x40 >> 6;
  lVar1 = uVar7 - 1;
  uVar3 = (ulong)(lVar1 * 0x40 == newLength);
  uVar6 = lVar1 - uVar3;
  if (uVar9 <= uVar6) {
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar11 = vpbroadcastq_avx512f();
    uVar7 = uVar7 - uVar3;
    if (uVar7 <= uVar9 + 1) {
      uVar7 = uVar9 + 1;
    }
    uVar3 = 0;
    auVar12 = vpbroadcastq_avx512f();
    do {
      auVar13 = vpbroadcastq_avx512f();
      auVar13 = vporq_avx512f(auVar13,auVar10);
      vpcmpuq_avx512f(auVar13,auVar12,2);
      auVar13 = vmovdqu64_avx512f(auVar11);
      *(undefined1 (*) [64])(__src + uVar9 + uVar3) = auVar13;
      uVar3 = uVar3 + 8;
    } while (((uVar7 - uVar9) + 7 & 0xfffffffffffffff8) != uVar3);
  }
  if ((newLength & 0x3f) != 0) {
    __src[uVar6].next = (Slot *)((ulong)__src[uVar6].next & ~(-1L << uVar8));
  }
LAB_00167e46:
  *(size_t *)(this + 8) = newLength;
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneHeap* heap, size_t newLength, size_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newLength);

  if (newLength <= _length) {
    // The size after the resize is lesser than or equal to the current length.
    size_t idx = newLength / kBitsPerWord;
    size_t bit = newLength % kBitsPerWord;

    // Just set all bits outside of the new length in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newLength` is a multiply of `kBitsPerWord` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_length`.
    if (bit)
      _data[idx] &= (static_cast<uintptr_t>(1) << bit) - 1U;

    _length = newLength;
    return kErrorOk;
  }

  size_t oldLength = _length;
  BitWord* data = _data;

  if (newLength > _capacity) {
    // Realloc needed... Calculate the minimum capacity (in bytes) requied.
    size_t minimumCapacityInBits = Utils::alignTo<size_t>(idealCapacity, kBitsPerWord);
    size_t allocatedCapacity;

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newLength))
      return DebugUtils::errored(kErrorNoHeapMemory);

    // Normalize to bytes.
    size_t minimumCapacity = minimumCapacityInBits / 8;
    BitWord* newData = static_cast<BitWord*>(heap->alloc(minimumCapacity, allocatedCapacity));

    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorNoHeapMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_heap->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    if (oldLength)
      ::memcpy(newData, data, _wordsPerBits(oldLength));

    if (data)
      heap->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = allocatedCapacityInBits;
  }

  // Start (of the old length) and end (of the new length) bits
  size_t idx = oldLength / kBitsPerWord;
  size_t startBit = oldLength % kBitsPerWord;
  size_t endBit = newLength % kBitsPerWord;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = _patternFromBit(newBitsValue);

  // First initialize the last bit-word of the old length.
  if (startBit) {
    size_t nBits = 0;

    if (idx == (newLength / kBitsPerWord)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old length.
      nBits = kBitsPerWord - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old length.
  size_t endIdx = _wordsPerBits(newLength);
  endIdx -= static_cast<size_t>(endIdx * kBitsPerWord == newLength);

  while (idx <= endIdx)
    data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx] &= (static_cast<BitWord>(1) << endBit) - 1;

  _length = newLength;
  return kErrorOk;
}